

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O0

int it_ptm_read_sample_data(IT_SAMPLE *sample,int last,DUMBFILE *f)

{
  char cVar1;
  char cVar2;
  int iVar3;
  void *pvVar4;
  DUMBFILE *in_RDX;
  int in_ESI;
  long in_RDI;
  uchar b;
  uchar a;
  int s;
  int32 n;
  DUMBFILE *in_stack_ffffffffffffffc8;
  undefined4 local_24;
  undefined4 local_4;
  
  iVar3 = 1;
  if ((*(byte *)(in_RDI + 0x32) & 2) != 0) {
    iVar3 = 2;
  }
  pvVar4 = malloc((long)(*(int *)(in_RDI + 0x38) * iVar3));
  *(void **)(in_RDI + 0x58) = pvVar4;
  if (*(long *)(in_RDI + 0x58) == 0) {
    local_4 = -1;
  }
  else {
    cVar2 = '\0';
    if ((*(byte *)(in_RDI + 0x32) & 2) == 0) {
      for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x38); local_24 = local_24 + 1) {
        iVar3 = it_ptm_read_byte(in_stack_ffffffffffffffc8);
        cVar2 = (char)iVar3 + cVar2;
        *(char *)(*(long *)(in_RDI + 0x58) + (long)local_24) = cVar2;
      }
    }
    else {
      for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x38); local_24 = local_24 + 1) {
        iVar3 = it_ptm_read_byte(in_stack_ffffffffffffffc8);
        cVar1 = (char)iVar3 + cVar2;
        iVar3 = it_ptm_read_byte(in_stack_ffffffffffffffc8);
        cVar2 = (char)iVar3 + cVar1;
        *(ushort *)(*(long *)(in_RDI + 0x58) + (long)local_24 * 2) = CONCAT11(cVar2,cVar1);
      }
    }
    iVar3 = dumbfile_error(in_RDX);
    if ((iVar3 == 0) || (in_ESI != 0)) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int it_ptm_read_sample_data(IT_SAMPLE *sample, int last, DUMBFILE *f)
{
	int32 n;
	int s;

	sample->data = malloc(sample->length * (sample->flags & IT_SAMPLE_16BIT ? 2 : 1));
	if (!sample->data)
		return -1;

	s = 0;

	if (sample->flags & IT_SAMPLE_16BIT) {
		unsigned char a, b;
		for (n = 0; n < sample->length; n++) {
			a = s += (signed char) it_ptm_read_byte(f);
			b = s += (signed char) it_ptm_read_byte(f);
			((short *)sample->data)[n] = a | (b << 8);
		}
	} else {
		for (n = 0; n < sample->length; n++) {
			s += (signed char) it_ptm_read_byte(f);
			((signed char *)sample->data)[n] = s;
		}
	}

	if (dumbfile_error(f) && !last)
		return -1;

	return 0;
}